

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

vec3 __thiscall djb::radial::u2_to_h2_std(radial *this,vec2 *u,vec3 *wi)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 extraout_XMM0_Qa;
  undefined8 uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  vec3 vVar8;
  
  fVar4 = SQRT(wi->x * wi->x + wi->y * wi->y);
  fVar5 = fVar4;
  (*(this->super_microfacet).super_brdf._vptr_brdf[0x10])((ulong)(uint)wi->z);
  uVar3 = extraout_XMM0_Qa;
  if (0.0 < fVar4) {
    uVar1 = wi->x;
    uVar2 = wi->y;
    fVar6 = (1.0 / fVar4) * (float)uVar1;
    fVar7 = (1.0 / fVar4) * (float)uVar2;
    fVar4 = (float)((ulong)extraout_XMM0_Qa >> 0x20);
    uVar3 = CONCAT44((float)extraout_XMM0_Qa * fVar7 + fVar6 * fVar4,
                     (float)extraout_XMM0_Qa * fVar6 + -fVar7 * fVar4);
  }
  vVar8.z = fVar5;
  vVar8.x = (float_t)(int)uVar3;
  vVar8.y = (float_t)(int)((ulong)uVar3 >> 0x20);
  return vVar8;
}

Assistant:

vec3 radial::u2_to_h2_std(const vec2 &u, const vec3 &wi) const
{
	float_t zi = wi.z;
	float_t z_i = sqrt(wi.x * wi.x + wi.y * wi.y);
	vec3 wm = u2_to_h2_std_radial(u, zi, z_i);

	// rotate for non-normal incidence
	if (z_i > 0) {
		float_t nrm = 1 / z_i;
		float_t c = wi.x * nrm;
		float_t s = wi.y * nrm;
		float_t x = c * wm.x - s * wm.y;
		float_t y = s * wm.x + c * wm.y;

		wm = vec3(x, y, wm.z);
	}

	return wm;
}